

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qerrormessage.cpp
# Opt level: O2

void __thiscall QErrorMessage::showMessage(QErrorMessage *this,QString *message,QString *type)

{
  QErrorMessagePrivate *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  Message local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QErrorMessagePrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  bVar1 = QErrorMessagePrivate::isMessageToBeShown(this_00,message,type);
  if (bVar1) {
    local_58.content.d.d = (message->d).d;
    local_58.content.d.ptr = (message->d).ptr;
    local_58.content.d.size = (message->d).size;
    if (local_58.content.d.d != (Data *)0x0) {
      LOCK();
      ((local_58.content.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.content.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    local_58.type.d.d = (type->d).d;
    local_58.type.d.ptr = (type->d).ptr;
    local_58.type.d.size = (type->d).size;
    if (local_58.type.d.d != (Data *)0x0) {
      LOCK();
      ((local_58.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    std::deque<QErrorMessagePrivate::Message,_std::allocator<QErrorMessagePrivate::Message>_>::
    emplace_back<QErrorMessagePrivate::Message>(&(this_00->pending).c,&local_58);
    QErrorMessagePrivate::Message::~Message(&local_58);
    if ((((this->super_QDialog).super_QWidget.data)->widget_attributes & 0x8000) == 0) {
      bVar1 = QErrorMessagePrivate::nextPending(this_00);
      if (bVar1) {
        QWidget::show((QWidget *)this);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QErrorMessage::showMessage(const QString &message, const QString &type)
{
    Q_D(QErrorMessage);
    if (!d->isMessageToBeShown(message, type))
        return;
    d->pending.push({message, type});
    if (!isVisible() && d->nextPending())
        show();
}